

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

bool __thiscall xmrig::Pool::isEnabled(Pool *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = std::bitset<2UL>::test(&this->m_flags,0);
  if (bVar1) {
    bVar2 = (this->m_url).m_port != 0 && (this->m_url).m_host.m_data != (char *)0x0;
  }
  return bVar2;
}

Assistant:

bool xmrig::Pool::isEnabled() const
{
#   ifndef XMRIG_FEATURE_TLS
    if (isTLS()) {
        return false;
    }
#   endif

#   ifndef XMRIG_FEATURE_HTTP
    if (m_mode == MODE_DAEMON) {
        return false;
    }
#   endif

#   ifndef XMRIG_FEATURE_HTTP
    if (m_mode == MODE_SELF_SELECT) {
        return false;
    }
#   endif

    return m_flags.test(FLAG_ENABLED) && isValid();
}